

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O3

double __thiscall S1Interval::Project(S1Interval *this,double p)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  S2LogMessage SStack_18;
  
  dVar6 = (this->bounds_).c_[0];
  dVar1 = (this->bounds_).c_[1];
  if ((((dVar6 != 3.141592653589793) || (NAN(dVar6))) || (dVar1 != -3.141592653589793)) ||
     (NAN(dVar1))) {
    if (ABS(p) <= 3.141592653589793) {
      dVar7 = (double)(~-(ulong)(p == -3.141592653589793) & (ulong)p |
                      -(ulong)(p == -3.141592653589793) & 0x400921fb54442d18);
      if (dVar6 <= dVar1) {
        if ((dVar6 <= dVar7) && (dVar7 <= dVar1)) {
          return dVar7;
        }
      }
      else if ((dVar6 <= dVar7) || (dVar7 <= dVar1)) {
        if (dVar6 != 3.141592653589793) {
          return dVar7;
        }
        if (NAN(dVar6)) {
          return dVar7;
        }
        if (dVar1 != -3.141592653589793) {
          return dVar7;
        }
        if (NAN(dVar1)) {
          return dVar7;
        }
      }
      uVar4 = -(ulong)(dVar6 - dVar7 < 0.0);
      uVar5 = -(ulong)(dVar7 - dVar1 < 0.0);
      uVar3 = (ulong)((dVar7 + 3.141592653589793) - (dVar1 + -3.141592653589793)) & uVar5;
      auVar8._0_8_ = ~uVar4 & (ulong)(dVar6 - dVar7);
      auVar8._8_8_ = ~uVar5 & (ulong)(dVar7 - dVar1);
      auVar2._8_4_ = (int)uVar3;
      auVar2._0_8_ = (ulong)((dVar6 + 3.141592653589793) - (dVar7 + -3.141592653589793)) & uVar4;
      auVar2._12_4_ = (int)(uVar3 >> 0x20);
      if (SUB168(auVar8 | auVar2,8) <= SUB168(auVar8 | auVar2,0)) {
        dVar6 = dVar1;
      }
      return dVar6;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xbb,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (fabs(p)) <= (3.14159265358979323846) ",0x34);
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
               ,0xba,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: !is_empty() ",0x1a);
  }
  abort();
}

Assistant:

double S1Interval::Project(double p) const {
  S2_DCHECK(!is_empty());
  S2_DCHECK_LE(fabs(p), M_PI);
  if (p == -M_PI) p = M_PI;
  if (FastContains(p)) return p;
  // Compute distance from p to each endpoint.
  double dlo = PositiveDistance(p, lo());
  double dhi = PositiveDistance(hi(), p);
  return (dlo < dhi) ? lo() : hi();
}